

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::Framebuffer::~Framebuffer(Framebuffer *this)

{
  Framebuffer *this_local;
  
  (*this->m_context->_vptr_Context[0xb])(this->m_context,1,&this->m_framebuffer);
  destroyBuffer(this,this->m_colorBuffer,(this->m_config).colorType);
  destroyBuffer(this,this->m_depthStencilBuffer,(this->m_config).depthStencilType);
  return;
}

Assistant:

Framebuffer::~Framebuffer (void)
{
	m_context.deleteFramebuffers(1, &m_framebuffer);
	destroyBuffer(m_colorBuffer, m_config.colorType);
	destroyBuffer(m_depthStencilBuffer, m_config.depthStencilType);
}